

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_index_type.h
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
IsLeftFaceVisited(MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this
                 ,CornerIndex corner_id)

{
  const_reference cVar1;
  uint uVar2;
  
  if (corner_id.value_ != 0xffffffff) {
    if (corner_id.value_ % 3 == 0) {
      uVar2 = corner_id.value_ + 2;
      if (uVar2 == 0xffffffff) {
        return true;
      }
    }
    else {
      uVar2 = corner_id.value_ - 1;
    }
    uVar2 = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)
                                ->opposite_corners_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     + (ulong)uVar2 * 4);
    if (uVar2 != 0xffffffff) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->visited_faces_,(ulong)uVar2 / 3);
      return cVar1;
    }
  }
  return true;
}

Assistant:

constexpr bool operator==(const IndexType &i) const {
    return value_ == i.value_;
  }